

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O0

void __thiscall
bal::GraphMLWeightedStreamWriter::write_clauses(GraphMLWeightedStreamWriter *this,Cnf *value)

{
  double dVar1;
  unsigned_long uVar2;
  bool bVar3;
  uint32_t uVar4;
  ostream *poVar5;
  uint32_t *puVar6;
  pointer ppVar7;
  reference ppVar8;
  variable_t local_120;
  literal_t local_11c;
  variable_t local_118;
  literal_t local_114;
  variableid_t local_110;
  variableid_t local_10c;
  variableid_t target_1;
  variableid_t source_1;
  pair<const_unsigned_long,_edge_data_t> edge;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  *__range2;
  pair<const_unsigned_long,_edge_data_t> local_c8;
  undefined1 local_b0 [8];
  edge_data_t edge_data;
  _Self local_98;
  iterator it;
  uint64_t key;
  variableid_t target;
  variableid_t source;
  int j;
  double weight;
  ushort local_5e;
  uint local_5c;
  uint16_t cardinality;
  int i;
  uint32_t *data_end;
  uint32_t *data;
  map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  existing_edges;
  Cnf *value_local;
  GraphMLWeightedStreamWriter *this_local;
  
  existing_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)value;
  poVar5 = StreamWriter<bal::Cnf>::stream((StreamWriter<bal::Cnf> *)this);
  std::ostream::operator<<(poVar5,std::dec);
  std::
  map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  ::map((map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
         *)&data);
  data_end = Cnf::data((Cnf *)existing_edges._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uVar4 = Cnf::data_size((Cnf *)existing_edges._M_t._M_impl.super__Rb_tree_header._M_node_count);
  puVar6 = data_end + uVar4;
  for (; data_end < puVar6; data_end = data_end + ((*data_end & 0xffff) + 1)) {
    for (local_5c = 0; local_5c < (*data_end & 0xffff); local_5c = local_5c + 1) {
      if (1 < (*data_end & 0xffff)) {
        local_5e = 1;
        if ((*data_end & 0xffff) < 4) {
          local_5e = get_cardinality_uint16(*(uint16_t *)((long)data_end + 2));
        }
        dVar1 = (((double)local_5e + (double)local_5e) / (double)(ushort)*data_end) /
                (double)((ushort)*data_end - 1);
        target = local_5c;
        while (target = target + 1, target < (*data_end & 0xffff)) {
          it._M_node = (_Base_ptr)
                       CONCAT44((data_end[(long)(int)target + 1] >> 1) - 1,
                                (data_end[(long)(int)local_5c + 1] >> 1) - 1);
          local_98._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
               ::find((map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
                       *)&data,(key_type *)&it);
          edge_data.weight =
               (double)std::
                       map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
                       ::end((map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
                              *)&data);
          bVar3 = std::operator==(&local_98,(_Self *)&edge_data.weight);
          if (bVar3) {
            local_b0._0_4_ = ZEXT24(local_5e);
            edge_data._0_8_ = dVar1;
            std::pair<const_unsigned_long,_edge_data_t>::
            pair<const_unsigned_long,_edge_data_t,_true>
                      (&local_c8,(unsigned_long *)&it,
                       (anon_struct_16_2_eb47c061_for_second *)local_b0);
            std::
            map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
            ::insert((map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
                      *)&data,&local_c8);
          }
          else {
            ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_edge_data_t>_>::
                     operator->(&local_98);
            (ppVar7->second).cardinality = (uint)local_5e + (ppVar7->second).cardinality;
            ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_edge_data_t>_>::
                     operator->(&local_98);
            (ppVar7->second).weight = dVar1 + (ppVar7->second).weight;
          }
        }
      }
    }
  }
  __end2 = std::
           map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
           ::begin((map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
                    *)&data);
  edge.second.weight =
       (double)std::
               map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
               ::end((map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
                      *)&data);
  while (bVar3 = std::operator!=(&__end2,(_Self *)&edge.second.weight), bVar3) {
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_edge_data_t>_>::operator*
                       (&__end2);
    edge.second._0_8_ = (ppVar8->second).weight;
    uVar2 = ppVar8->first;
    edge.first = *(unsigned_long *)&ppVar8->second;
    target_1 = (variableid_t)uVar2;
    local_10c = target_1;
    source_1 = (variableid_t)(uVar2 >> 0x20);
    local_110 = source_1;
    _target_1 = uVar2;
    poVar5 = StreamWriter<bal::Cnf>::stream((StreamWriter<bal::Cnf> *)this);
    poVar5 = std::operator<<(poVar5,"<edge source=\"v");
    variable_t::variable_t(&local_118,local_10c);
    literal_t::literal_t(&local_114,local_118);
    poVar5 = operator<<(poVar5,&local_114);
    poVar5 = std::operator<<(poVar5,"\" target=\"v");
    variable_t::variable_t(&local_120,local_110);
    literal_t::literal_t(&local_11c,local_120);
    poVar5 = operator<<(poVar5,&local_11c);
    poVar5 = std::operator<<(poVar5,"\">");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = StreamWriter<bal::Cnf>::stream((StreamWriter<bal::Cnf> *)this);
    poVar5 = std::operator<<(poVar5,"<data key=\"e_cardinality\">");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)edge.first);
    poVar5 = std::operator<<(poVar5,"</data>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = StreamWriter<bal::Cnf>::stream((StreamWriter<bal::Cnf> *)this);
    poVar5 = std::operator<<(poVar5,"<data key=\"e_weight\">");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)edge.second._0_8_);
    poVar5 = std::operator<<(poVar5,"</data>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = StreamWriter<bal::Cnf>::stream((StreamWriter<bal::Cnf> *)this);
    poVar5 = std::operator<<(poVar5,"</edge>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_edge_data_t>_>::operator++(&__end2);
  }
  std::
  map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
  ::~map((map<unsigned_long,_edge_data_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_edge_data_t>_>_>
          *)&data);
  return;
}

Assistant:

virtual void write_clauses(const Cnf& value) override {
            typedef struct {
                unsigned cardinality;
                double weight;
            } edge_data_t;
            
            stream() << std::dec;
            std::map<uint64_t, edge_data_t> existing_edges;
            
            const uint32_t* data = value.data();
            const uint32_t* data_end = data + value.data_size();
            while (data < data_end) {
                // iterate literal pairs
                // it is guaranteed that the sequence is sorted and no duplicates exist
                // weight is calculated such that the sum of weights of edges generated from a clause is 1
                for (auto i = 0; i < _clause_size(data); i++) {
                    if (_clause_size(data) > 1) {
                        uint16_t cardinality = 1;
                        if (_clause_size(data) < 4) {
                            cardinality = get_cardinality_uint16(_clause_flags(data));
                        };
                        
                        const double weight = 2.0 * cardinality / _clause_size(data) / (_clause_size(data) - 1);
                        
                        for (auto j = i + 1; j < _clause_size(data); j++) {
                            const variableid_t source = literal_t__variable_id(_clause_literal(data, i));
                            const variableid_t target = literal_t__variable_id(_clause_literal(data, j));
                            const uint64_t key = ((uint64_t)target << 32) | source;
                            
                            // check if the adge exists already; ignore if so, add otherwise
                            auto it = existing_edges.find(key);
                            if (it == existing_edges.end()) {
                                const edge_data_t edge_data{cardinality, weight};
                                existing_edges.insert({key, edge_data});
                            } else {
                                it->second.cardinality += cardinality;
                                it->second.weight += weight;
                            };
                        };
                    };
                };
                
                data += _clause_memory_size(data);
            };
            
            for (auto edge: existing_edges) {
                const variableid_t source = edge.first & 0xFFFFFFFF;
                const variableid_t target = edge.first >> 32;
                
                stream() << "<edge source=\"v" << literal_t(variable_t(source)) << "\" target=\"v" << literal_t(variable_t(target)) << "\">" << std::endl;
                stream() << "<data key=\"e_cardinality\">" << edge.second.cardinality << "</data>" << std::endl;
                stream() << "<data key=\"e_weight\">" << edge.second.weight << "</data>" << std::endl;
                stream() << "</edge>" << std::endl;
            };
        }